

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ir.c
# Opt level: O1

void lj_ir_kvalue(lua_State *L,TValue *tv,IRIns *ir)

{
  long *plVar1;
  byte bVar2;
  void *pvVar3;
  IRIns IVar4;
  
  switch((ir->field_1).o) {
  case '\x16':
    (tv->field_2).it = (int)(char)(~(ir->field_1).t.irt | 0xe0);
    break;
  case '\x17':
    IVar4 = (IRIns)(double)ir->i;
    goto LAB_0012d493;
  case '\x18':
    bVar2 = (ir->field_1).t.irt;
    (tv->field_2).field_0 =
         (anon_union_4_2_de2f9c34_for_anon_struct_8_2_fd66bcdd_for_TValue_2_0)(ir->field_1).op12;
    (tv->field_2).it = (int)(char)(~bVar2 | 0xe0);
    break;
  case '\x19':
  case '\x1a':
    IVar4 = (IRIns)(double)(ir->field_1).op12;
    goto LAB_0012d493;
  case '\x1b':
    tv->u64 = 0;
    break;
  case '\x1c':
    IVar4 = ir[1];
LAB_0012d493:
    *tv = (TValue)IVar4;
    break;
  case '\x1d':
    pvVar3 = lj_mem_newgco(L,0x10);
    *(undefined1 *)((long)pvVar3 + 5) = 10;
    *(undefined2 *)((long)pvVar3 + 6) = 0xb;
    plVar1 = (long *)((ulong)(L->glref).ptr32 + 0xe0);
    *plVar1 = *plVar1 + 1;
    *(IRIns *)((long)pvVar3 + 8) = ir[1];
    (tv->u32).lo = (uint32_t)pvVar3;
    (tv->field_2).it = 0xfffffff5;
  }
  return;
}

Assistant:

void lj_ir_kvalue(lua_State *L, TValue *tv, const IRIns *ir)
{
  UNUSED(L);
  lj_assertL(ir->o != IR_KSLOT, "unexpected KSLOT");  /* Common mistake. */
  switch (ir->o) {
  case IR_KPRI: setpriV(tv, irt_toitype(ir->t)); break;
  case IR_KINT: setintV(tv, ir->i); break;
  case IR_KGC: setgcV(L, tv, ir_kgc(ir), irt_toitype(ir->t)); break;
  case IR_KPTR: case IR_KKPTR:
    setnumV(tv, (lua_Number)(uintptr_t)ir_kptr(ir));
    break;
  case IR_KNULL: setintV(tv, 0); break;
  case IR_KNUM: setnumV(tv, ir_knum(ir)->n); break;
#if LJ_HASFFI
  case IR_KINT64: {
    GCcdata *cd = lj_cdata_new_(L, CTID_INT64, 8);
    *(uint64_t *)cdataptr(cd) = ir_kint64(ir)->u64;
    setcdataV(L, tv, cd);
    break;
    }
#endif
  default: lj_assertL(0, "bad IR constant op %d", ir->o); break;
  }
}